

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O0

bool __thiscall MyGame::Example::Monster::Verify(Monster *this,Verifier *verifier)

{
  bool bVar1;
  Any type;
  AnyUniqueAliases type_00;
  AnyAmbiguousAliases type_01;
  String *str;
  Vector<unsigned_char,_unsigned_int> *pVVar2;
  void *pvVar3;
  Vector<const_MyGame::Example::Test_*,_unsigned_int> *pVVar4;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVVar5;
  Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int> *pVVar6;
  Monster *table;
  Stat *table_00;
  Vector<const_MyGame::Example::Ability_*,_unsigned_int> *vec;
  Vector<long,_unsigned_int> *vec_00;
  Vector<double,_unsigned_int> *vec_01;
  InParentNamespace *table_01;
  Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int> *pVVar7;
  Vector<unsigned_long,_unsigned_int> *pVVar8;
  Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int> *pVVar9;
  undefined1 local_19;
  Verifier *verifier_local;
  Monster *this_local;
  
  bVar1 = flatbuffers::Table::VerifyTableStart(&this->super_Table,verifier);
  local_19 = false;
  if (bVar1) {
    bVar1 = flatbuffers::Table::VerifyField<MyGame::Example::Vec3>(&this->super_Table,verifier,4,8);
    local_19 = false;
    if (bVar1) {
      bVar1 = flatbuffers::Table::VerifyField<short>(&this->super_Table,verifier,6,2);
      local_19 = false;
      if (bVar1) {
        bVar1 = flatbuffers::Table::VerifyField<short>(&this->super_Table,verifier,8,2);
        local_19 = false;
        if (bVar1) {
          bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                            (&this->super_Table,verifier,10);
          local_19 = false;
          if (bVar1) {
            str = name(this);
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
            local_19 = false;
            if (bVar1) {
              bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                (&this->super_Table,verifier,0xe);
              local_19 = false;
              if (bVar1) {
                pVVar2 = inventory(this);
                bVar1 = flatbuffers::VerifierTemplate<false>::
                        VerifyVector<unsigned_char,_unsigned_int>(verifier,pVVar2);
                local_19 = false;
                if (bVar1) {
                  bVar1 = flatbuffers::Table::VerifyField<unsigned_char>
                                    (&this->super_Table,verifier,0x10,1);
                  local_19 = false;
                  if (bVar1) {
                    bVar1 = flatbuffers::Table::VerifyField<unsigned_char>
                                      (&this->super_Table,verifier,0x12,1);
                    local_19 = false;
                    if (bVar1) {
                      bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                        (&this->super_Table,verifier,0x14);
                      local_19 = false;
                      if (bVar1) {
                        pvVar3 = test(this);
                        type = test_type(this);
                        bVar1 = VerifyAny(verifier,pvVar3,type);
                        local_19 = false;
                        if (bVar1) {
                          bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                            (&this->super_Table,verifier,0x16);
                          local_19 = false;
                          if (bVar1) {
                            pVVar4 = test4(this);
                            bVar1 = flatbuffers::VerifierTemplate<false>::
                                    VerifyVector<MyGame::Example::Test,_unsigned_int>
                                              (verifier,pVVar4);
                            local_19 = false;
                            if (bVar1) {
                              bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                                (&this->super_Table,verifier,0x18);
                              local_19 = false;
                              if (bVar1) {
                                pVVar5 = testarrayofstring(this);
                                bVar1 = flatbuffers::VerifierTemplate<false>::
                                        VerifyVector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>
                                                  (verifier,pVVar5);
                                local_19 = false;
                                if (bVar1) {
                                  pVVar5 = testarrayofstring(this);
                                  bVar1 = flatbuffers::VerifierTemplate<false>::
                                          VerifyVectorOfStrings(verifier,pVVar5);
                                  local_19 = false;
                                  if (bVar1) {
                                    bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                                      (&this->super_Table,verifier,0x1a);
                                    local_19 = false;
                                    if (bVar1) {
                                      pVVar6 = testarrayoftables(this);
                                      bVar1 = flatbuffers::VerifierTemplate<false>::
                                              VerifyVector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>
                                                        (verifier,pVVar6);
                                      local_19 = false;
                                      if (bVar1) {
                                        pVVar6 = testarrayoftables(this);
                                        bVar1 = flatbuffers::VerifierTemplate<false>::
                                                VerifyVectorOfTables<MyGame::Example::Monster>
                                                          (verifier,pVVar6);
                                        local_19 = false;
                                        if (bVar1) {
                                          bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                                            (&this->super_Table,verifier,0x1c);
                                          local_19 = false;
                                          if (bVar1) {
                                            table = enemy(this);
                                            bVar1 = flatbuffers::VerifierTemplate<false>::
                                                    VerifyTable<MyGame::Example::Monster>
                                                              (verifier,table);
                                            local_19 = false;
                                            if (bVar1) {
                                              bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                                                (&this->super_Table,verifier,0x1e);
                                              local_19 = false;
                                              if (bVar1) {
                                                pVVar2 = testnestedflatbuffer(this);
                                                bVar1 = flatbuffers::VerifierTemplate<false>::
                                                        VerifyVector<unsigned_char,_unsigned_int>
                                                                  (verifier,pVVar2);
                                                local_19 = false;
                                                if (bVar1) {
                                                  pVVar2 = testnestedflatbuffer(this);
                                                  bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                                    
                                                  VerifyNestedFlatBuffer<MyGame::Example::Monster,_unsigned_int>
                                                            (verifier,pVVar2,(char *)0x0);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyOffset<unsigned_int>
                                                                      (&this->super_Table,verifier,
                                                                       0x20);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      table_00 = testempty(this);
                                                      bVar1 = flatbuffers::VerifierTemplate<false>::
                                                              VerifyTable<MyGame::Example::Stat>
                                                                        (verifier,table_00);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        bVar1 = flatbuffers::Table::
                                                                VerifyField<unsigned_char>
                                                                          (&this->super_Table,
                                                                           verifier,0x22,1);
                                                        local_19 = false;
                                                        if (bVar1) {
                                                          bVar1 = flatbuffers::Table::
                                                                  VerifyField<int>(&this->
                                                  super_Table,verifier,0x24,4);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyField<unsigned_int>
                                                                      (&this->super_Table,verifier,
                                                                       0x26,4);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      bVar1 = flatbuffers::Table::VerifyField<long>
                                                                        (&this->super_Table,verifier
                                                                         ,0x28,8);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        bVar1 = flatbuffers::Table::
                                                                VerifyField<unsigned_long>
                                                                          (&this->super_Table,
                                                                           verifier,0x2a,8);
                                                        local_19 = false;
                                                        if (bVar1) {
                                                          bVar1 = flatbuffers::Table::
                                                                  VerifyField<int>(&this->
                                                  super_Table,verifier,0x2c,4);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyField<unsigned_int>
                                                                      (&this->super_Table,verifier,
                                                                       0x2e,4);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      bVar1 = flatbuffers::Table::VerifyField<long>
                                                                        (&this->super_Table,verifier
                                                                         ,0x30,8);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        bVar1 = flatbuffers::Table::
                                                                VerifyField<unsigned_long>
                                                                          (&this->super_Table,
                                                                           verifier,0x32,8);
                                                        local_19 = false;
                                                        if (bVar1) {
                                                          bVar1 = flatbuffers::Table::
                                                                  VerifyOffset<unsigned_int>
                                                                            (&this->super_Table,
                                                                             verifier,0x34);
                                                          local_19 = false;
                                                          if (bVar1) {
                                                            pVVar2 = testarrayofbools(this);
                                                            bVar1 = flatbuffers::
                                                                    VerifierTemplate<false>::
                                                                                                                                        
                                                  VerifyVector<unsigned_char,_unsigned_int>
                                                            (verifier,pVVar2);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::VerifyField<float>
                                                                      (&this->super_Table,verifier,
                                                                       0x36,4);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      bVar1 = flatbuffers::Table::VerifyField<float>
                                                                        (&this->super_Table,verifier
                                                                         ,0x38,4);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        bVar1 = flatbuffers::Table::
                                                                VerifyField<float>(&this->
                                                  super_Table,verifier,0x3a,4);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyOffset<unsigned_int>
                                                                      (&this->super_Table,verifier,
                                                                       0x3c);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      pVVar5 = testarrayofstring2(this);
                                                      bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                                            
                                                  VerifyVector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>
                                                            (verifier,pVVar5);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    pVVar5 = testarrayofstring2(this);
                                                    bVar1 = flatbuffers::VerifierTemplate<false>::
                                                            VerifyVectorOfStrings(verifier,pVVar5);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      bVar1 = flatbuffers::Table::
                                                              VerifyOffset<unsigned_int>
                                                                        (&this->super_Table,verifier
                                                                         ,0x3e);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        vec = testarrayofsortedstruct(this);
                                                        bVar1 = flatbuffers::VerifierTemplate<false>
                                                                ::
                                                  VerifyVector<MyGame::Example::Ability,_unsigned_int>
                                                            (verifier,vec);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyOffset<unsigned_int>
                                                                      (&this->super_Table,verifier,
                                                                       0x40);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      pVVar2 = flex(this);
                                                      bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                                            
                                                  VerifyVector<unsigned_char,_unsigned_int>
                                                            (verifier,pVVar2);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    pVVar2 = flex(this);
                                                    bVar1 = flexbuffers::VerifyNestedFlexBuffer
                                                                      (pVVar2,verifier);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      bVar1 = flatbuffers::Table::
                                                              VerifyOffset<unsigned_int>
                                                                        (&this->super_Table,verifier
                                                                         ,0x42);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        pVVar4 = test5(this);
                                                        bVar1 = flatbuffers::VerifierTemplate<false>
                                                                ::
                                                  VerifyVector<MyGame::Example::Test,_unsigned_int>
                                                            (verifier,pVVar4);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyOffset<unsigned_int>
                                                                      (&this->super_Table,verifier,
                                                                       0x44);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      vec_00 = vector_of_longs(this);
                                                      bVar1 = flatbuffers::VerifierTemplate<false>::
                                                              VerifyVector<long,_unsigned_int>
                                                                        (verifier,vec_00);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        bVar1 = flatbuffers::Table::
                                                                VerifyOffset<unsigned_int>
                                                                          (&this->super_Table,
                                                                           verifier,0x46);
                                                        local_19 = false;
                                                        if (bVar1) {
                                                          vec_01 = vector_of_doubles(this);
                                                          bVar1 = flatbuffers::
                                                                  VerifierTemplate<false>::
                                                                  VerifyVector<double,_unsigned_int>
                                                                            (verifier,vec_01);
                                                          local_19 = false;
                                                          if (bVar1) {
                                                            bVar1 = flatbuffers::Table::
                                                                    VerifyOffset<unsigned_int>
                                                                              (&this->super_Table,
                                                                               verifier,0x48);
                                                            local_19 = false;
                                                            if (bVar1) {
                                                              table_01 = parent_namespace_test(this)
                                                              ;
                                                              bVar1 = flatbuffers::
                                                                      VerifierTemplate<false>::
                                                                                                                                            
                                                  VerifyTable<MyGame::InParentNamespace>
                                                            (verifier,table_01);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyOffset<unsigned_int>
                                                                      (&this->super_Table,verifier,
                                                                       0x4a);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      pVVar7 = vector_of_referrables(this);
                                                      bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                                            
                                                  VerifyVector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>
                                                            (verifier,pVVar7);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    pVVar7 = vector_of_referrables(this);
                                                    bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                                        
                                                  VerifyVectorOfTables<MyGame::Example::Referrable>
                                                            (verifier,pVVar7);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyField<unsigned_long>
                                                                      (&this->super_Table,verifier,
                                                                       0x4c,8);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      bVar1 = flatbuffers::Table::
                                                              VerifyOffset<unsigned_int>
                                                                        (&this->super_Table,verifier
                                                                         ,0x4e);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        pVVar8 = vector_of_weak_references(this);
                                                        bVar1 = flatbuffers::VerifierTemplate<false>
                                                                ::
                                                  VerifyVector<unsigned_long,_unsigned_int>
                                                            (verifier,pVVar8);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyOffset<unsigned_int>
                                                                      (&this->super_Table,verifier,
                                                                       0x50);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      pVVar7 = vector_of_strong_referrables(this);
                                                      bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                                            
                                                  VerifyVector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>
                                                            (verifier,pVVar7);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    pVVar7 = vector_of_strong_referrables(this);
                                                    bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                                        
                                                  VerifyVectorOfTables<MyGame::Example::Referrable>
                                                            (verifier,pVVar7);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyField<unsigned_long>
                                                                      (&this->super_Table,verifier,
                                                                       0x52,8);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      bVar1 = flatbuffers::Table::
                                                              VerifyOffset<unsigned_int>
                                                                        (&this->super_Table,verifier
                                                                         ,0x54);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        pVVar8 = vector_of_co_owning_references
                                                                           (this);
                                                        bVar1 = flatbuffers::VerifierTemplate<false>
                                                                ::
                                                  VerifyVector<unsigned_long,_unsigned_int>
                                                            (verifier,pVVar8);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyField<unsigned_long>
                                                                      (&this->super_Table,verifier,
                                                                       0x56,8);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      bVar1 = flatbuffers::Table::
                                                              VerifyOffset<unsigned_int>
                                                                        (&this->super_Table,verifier
                                                                         ,0x58);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        pVVar8 = vector_of_non_owning_references
                                                                           (this);
                                                        bVar1 = flatbuffers::VerifierTemplate<false>
                                                                ::
                                                  VerifyVector<unsigned_long,_unsigned_int>
                                                            (verifier,pVVar8);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyField<unsigned_char>
                                                                      (&this->super_Table,verifier,
                                                                       0x5a,1);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      bVar1 = flatbuffers::Table::
                                                              VerifyOffset<unsigned_int>
                                                                        (&this->super_Table,verifier
                                                                         ,0x5c);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        pvVar3 = any_unique(this);
                                                        type_00 = any_unique_type(this);
                                                        bVar1 = VerifyAnyUniqueAliases
                                                                          (verifier,pvVar3,type_00);
                                                        local_19 = false;
                                                        if (bVar1) {
                                                          bVar1 = flatbuffers::Table::
                                                                  VerifyField<unsigned_char>
                                                                            (&this->super_Table,
                                                                             verifier,0x5e,1);
                                                          local_19 = false;
                                                          if (bVar1) {
                                                            bVar1 = flatbuffers::Table::
                                                                    VerifyOffset<unsigned_int>
                                                                              (&this->super_Table,
                                                                               verifier,0x60);
                                                            local_19 = false;
                                                            if (bVar1) {
                                                              pvVar3 = any_ambiguous(this);
                                                              type_01 = any_ambiguous_type(this);
                                                              bVar1 = VerifyAnyAmbiguousAliases
                                                                                (verifier,pvVar3,
                                                                                 type_01);
                                                              local_19 = false;
                                                              if (bVar1) {
                                                                bVar1 = flatbuffers::Table::
                                                                        VerifyOffset<unsigned_int>
                                                                                  (&this->
                                                  super_Table,verifier,0x62);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    pVVar2 = vector_of_enums(this);
                                                    bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                                        
                                                  VerifyVector<unsigned_char,_unsigned_int>
                                                            (verifier,pVVar2);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyField<signed_char>
                                                                      (&this->super_Table,verifier,
                                                                       100,1);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      bVar1 = flatbuffers::Table::
                                                              VerifyOffset<unsigned_int>
                                                                        (&this->super_Table,verifier
                                                                         ,0x66);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        pVVar2 = testrequirednestedflatbuffer(this);
                                                        bVar1 = flatbuffers::VerifierTemplate<false>
                                                                ::
                                                  VerifyVector<unsigned_char,_unsigned_int>
                                                            (verifier,pVVar2);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    pVVar2 = testrequirednestedflatbuffer(this);
                                                    bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                                        
                                                  VerifyNestedFlatBuffer<MyGame::Example::Monster,_unsigned_int>
                                                            (verifier,pVVar2,(char *)0x0);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyOffset<unsigned_int>
                                                                      (&this->super_Table,verifier,
                                                                       0x68);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      pVVar9 = scalar_key_sorted_tables(this);
                                                      bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                                            
                                                  VerifyVector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>
                                                            (verifier,pVVar9);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    pVVar9 = scalar_key_sorted_tables(this);
                                                    bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                                        
                                                  VerifyVectorOfTables<MyGame::Example::Stat>
                                                            (verifier,pVVar9);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyField<MyGame::Example::Test>
                                                                      (&this->super_Table,verifier,
                                                                       0x6a,2);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      bVar1 = flatbuffers::Table::
                                                              VerifyField<unsigned_long>
                                                                        (&this->super_Table,verifier
                                                                         ,0x6c,8);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        bVar1 = flatbuffers::Table::
                                                                VerifyField<unsigned_long>
                                                                          (&this->super_Table,
                                                                           verifier,0x6e,8);
                                                        local_19 = false;
                                                        if (bVar1) {
                                                          bVar1 = flatbuffers::Table::
                                                                  VerifyField<float>(&this->
                                                  super_Table,verifier,0x70,4);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::VerifyField<float>
                                                                      (&this->super_Table,verifier,
                                                                       0x72,4);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      bVar1 = flatbuffers::Table::VerifyField<float>
                                                                        (&this->super_Table,verifier
                                                                         ,0x74,4);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        bVar1 = flatbuffers::Table::
                                                                VerifyField<float>(&this->
                                                  super_Table,verifier,0x76,4);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::VerifyField<float>
                                                                      (&this->super_Table,verifier,
                                                                       0x78,4);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      bVar1 = flatbuffers::Table::VerifyField<float>
                                                                        (&this->super_Table,verifier
                                                                         ,0x7a,4);
                                                      local_19 = false;
                                                      if (bVar1) {
                                                        bVar1 = flatbuffers::Table::
                                                                VerifyField<float>(&this->
                                                  super_Table,verifier,0x7c,4);
                                                  local_19 = false;
                                                  if (bVar1) {
                                                    bVar1 = flatbuffers::Table::VerifyField<double>
                                                                      (&this->super_Table,verifier,
                                                                       0x7e,8);
                                                    local_19 = false;
                                                    if (bVar1) {
                                                      local_19 = flatbuffers::
                                                                 VerifierTemplate<false>::EndTable
                                                                           (verifier);
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyField<MyGame::Example::Vec3>(verifier, VT_POS, 8) &&
           VerifyField<int16_t>(verifier, VT_MANA, 2) &&
           VerifyField<int16_t>(verifier, VT_HP, 2) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyOffset(verifier, VT_INVENTORY) &&
           verifier.VerifyVector(inventory()) &&
           VerifyField<uint8_t>(verifier, VT_COLOR, 1) &&
           VerifyField<uint8_t>(verifier, VT_TEST_TYPE, 1) &&
           VerifyOffset(verifier, VT_TEST) &&
           VerifyAny(verifier, test(), test_type()) &&
           VerifyOffset(verifier, VT_TEST4) &&
           verifier.VerifyVector(test4()) &&
           VerifyOffset(verifier, VT_TESTARRAYOFSTRING) &&
           verifier.VerifyVector(testarrayofstring()) &&
           verifier.VerifyVectorOfStrings(testarrayofstring()) &&
           VerifyOffset(verifier, VT_TESTARRAYOFTABLES) &&
           verifier.VerifyVector(testarrayoftables()) &&
           verifier.VerifyVectorOfTables(testarrayoftables()) &&
           VerifyOffset(verifier, VT_ENEMY) &&
           verifier.VerifyTable(enemy()) &&
           VerifyOffset(verifier, VT_TESTNESTEDFLATBUFFER) &&
           verifier.VerifyVector(testnestedflatbuffer()) &&
           verifier.VerifyNestedFlatBuffer<MyGame::Example::Monster>(testnestedflatbuffer(), nullptr) &&
           VerifyOffset(verifier, VT_TESTEMPTY) &&
           verifier.VerifyTable(testempty()) &&
           VerifyField<uint8_t>(verifier, VT_TESTBOOL, 1) &&
           VerifyField<int32_t>(verifier, VT_TESTHASHS32_FNV1, 4) &&
           VerifyField<uint32_t>(verifier, VT_TESTHASHU32_FNV1, 4) &&
           VerifyField<int64_t>(verifier, VT_TESTHASHS64_FNV1, 8) &&
           VerifyField<uint64_t>(verifier, VT_TESTHASHU64_FNV1, 8) &&
           VerifyField<int32_t>(verifier, VT_TESTHASHS32_FNV1A, 4) &&
           VerifyField<uint32_t>(verifier, VT_TESTHASHU32_FNV1A, 4) &&
           VerifyField<int64_t>(verifier, VT_TESTHASHS64_FNV1A, 8) &&
           VerifyField<uint64_t>(verifier, VT_TESTHASHU64_FNV1A, 8) &&
           VerifyOffset(verifier, VT_TESTARRAYOFBOOLS) &&
           verifier.VerifyVector(testarrayofbools()) &&
           VerifyField<float>(verifier, VT_TESTF, 4) &&
           VerifyField<float>(verifier, VT_TESTF2, 4) &&
           VerifyField<float>(verifier, VT_TESTF3, 4) &&
           VerifyOffset(verifier, VT_TESTARRAYOFSTRING2) &&
           verifier.VerifyVector(testarrayofstring2()) &&
           verifier.VerifyVectorOfStrings(testarrayofstring2()) &&
           VerifyOffset(verifier, VT_TESTARRAYOFSORTEDSTRUCT) &&
           verifier.VerifyVector(testarrayofsortedstruct()) &&
           VerifyOffset(verifier, VT_FLEX) &&
           verifier.VerifyVector(flex()) &&
           flexbuffers::VerifyNestedFlexBuffer(flex(), verifier) &&
           VerifyOffset(verifier, VT_TEST5) &&
           verifier.VerifyVector(test5()) &&
           VerifyOffset(verifier, VT_VECTOR_OF_LONGS) &&
           verifier.VerifyVector(vector_of_longs()) &&
           VerifyOffset(verifier, VT_VECTOR_OF_DOUBLES) &&
           verifier.VerifyVector(vector_of_doubles()) &&
           VerifyOffset(verifier, VT_PARENT_NAMESPACE_TEST) &&
           verifier.VerifyTable(parent_namespace_test()) &&
           VerifyOffset(verifier, VT_VECTOR_OF_REFERRABLES) &&
           verifier.VerifyVector(vector_of_referrables()) &&
           verifier.VerifyVectorOfTables(vector_of_referrables()) &&
           VerifyField<uint64_t>(verifier, VT_SINGLE_WEAK_REFERENCE, 8) &&
           VerifyOffset(verifier, VT_VECTOR_OF_WEAK_REFERENCES) &&
           verifier.VerifyVector(vector_of_weak_references()) &&
           VerifyOffset(verifier, VT_VECTOR_OF_STRONG_REFERRABLES) &&
           verifier.VerifyVector(vector_of_strong_referrables()) &&
           verifier.VerifyVectorOfTables(vector_of_strong_referrables()) &&
           VerifyField<uint64_t>(verifier, VT_CO_OWNING_REFERENCE, 8) &&
           VerifyOffset(verifier, VT_VECTOR_OF_CO_OWNING_REFERENCES) &&
           verifier.VerifyVector(vector_of_co_owning_references()) &&
           VerifyField<uint64_t>(verifier, VT_NON_OWNING_REFERENCE, 8) &&
           VerifyOffset(verifier, VT_VECTOR_OF_NON_OWNING_REFERENCES) &&
           verifier.VerifyVector(vector_of_non_owning_references()) &&
           VerifyField<uint8_t>(verifier, VT_ANY_UNIQUE_TYPE, 1) &&
           VerifyOffset(verifier, VT_ANY_UNIQUE) &&
           VerifyAnyUniqueAliases(verifier, any_unique(), any_unique_type()) &&
           VerifyField<uint8_t>(verifier, VT_ANY_AMBIGUOUS_TYPE, 1) &&
           VerifyOffset(verifier, VT_ANY_AMBIGUOUS) &&
           VerifyAnyAmbiguousAliases(verifier, any_ambiguous(), any_ambiguous_type()) &&
           VerifyOffset(verifier, VT_VECTOR_OF_ENUMS) &&
           verifier.VerifyVector(vector_of_enums()) &&
           VerifyField<int8_t>(verifier, VT_SIGNED_ENUM, 1) &&
           VerifyOffset(verifier, VT_TESTREQUIREDNESTEDFLATBUFFER) &&
           verifier.VerifyVector(testrequirednestedflatbuffer()) &&
           verifier.VerifyNestedFlatBuffer<MyGame::Example::Monster>(testrequirednestedflatbuffer(), nullptr) &&
           VerifyOffset(verifier, VT_SCALAR_KEY_SORTED_TABLES) &&
           verifier.VerifyVector(scalar_key_sorted_tables()) &&
           verifier.VerifyVectorOfTables(scalar_key_sorted_tables()) &&
           VerifyField<MyGame::Example::Test>(verifier, VT_NATIVE_INLINE, 2) &&
           VerifyField<uint64_t>(verifier, VT_LONG_ENUM_NON_ENUM_DEFAULT, 8) &&
           VerifyField<uint64_t>(verifier, VT_LONG_ENUM_NORMAL_DEFAULT, 8) &&
           VerifyField<float>(verifier, VT_NAN_DEFAULT, 4) &&
           VerifyField<float>(verifier, VT_INF_DEFAULT, 4) &&
           VerifyField<float>(verifier, VT_POSITIVE_INF_DEFAULT, 4) &&
           VerifyField<float>(verifier, VT_INFINITY_DEFAULT, 4) &&
           VerifyField<float>(verifier, VT_POSITIVE_INFINITY_DEFAULT, 4) &&
           VerifyField<float>(verifier, VT_NEGATIVE_INF_DEFAULT, 4) &&
           VerifyField<float>(verifier, VT_NEGATIVE_INFINITY_DEFAULT, 4) &&
           VerifyField<double>(verifier, VT_DOUBLE_INF_DEFAULT, 8) &&
           verifier.EndTable();
  }